

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triangle.cpp
# Opt level: O0

void __thiscall OpenMD::Triangle::addVertices(Triangle *this,Vector3d *P1,Vector3d *P2,Vector3d *P3)

{
  Vector<double,_3U> *in_RCX;
  Vector<double,_3U> *in_RDX;
  Vector3<double> *in_RSI;
  
  Vector3<double>::operator=((Vector3<double> *)in_RDX,in_RSI);
  Vector3<double>::operator=((Vector3<double> *)in_RDX,in_RSI);
  Vector3<double>::operator=((Vector3<double> *)in_RDX,in_RSI);
  OpenMD::operator-(in_RCX,in_RDX);
  Vector3<double>::operator=((Vector3<double> *)in_RCX,in_RDX);
  OpenMD::operator-(in_RCX,in_RDX);
  Vector3<double>::operator=((Vector3<double> *)in_RCX,in_RDX);
  OpenMD::operator-(in_RCX,in_RDX);
  Vector3<double>::operator=((Vector3<double> *)in_RCX,in_RDX);
  return;
}

Assistant:

void Triangle::addVertices(Vector3d P1, Vector3d P2, Vector3d P3) {
  vertices_[0] = P1;
  vertices_[1] = P2;
  vertices_[2] = P3;

  // Compute some quantites like a,b,c
  a_ = P1 - P2;
  b_ = P1 - P3;
  c_ = P2 - P3;
}